

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O1

void __thiscall
CheckedSharedMutexTest_AbandonMutexSide_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
::~CheckedSharedMutexTest_AbandonMutexSide_Test
          (CheckedSharedMutexTest_AbandonMutexSide_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, AbandonMutexSide) {
  auto test_body = []{
    yamc::test::barrier step(2);
    auto pmtx = yamc::cxx::make_unique<TypeParam>();
    // owner-thread
    yamc::test::join_thread thd([&]{
      ASSERT_NO_THROW(pmtx->lock_shared());
      step.await();  // b1
      step.await();  // b2
    });
    // other-thread
    {
      step.await();  // b1
      EXPECT_CHECK_FAILURE_INNER({
        delete pmtx.release();
      });
      step.await();  // b2
    }
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}